

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateMembers
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *pFVar1;
  
  variables = &(this->super_ImmutableEnumFieldLiteGenerator).variables_;
  PrintExtraFieldInfo(variables,printer);
  pFVar1 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  if (*(int *)(*(long *)(pFVar1 + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,pFVar1);
    io::Printer::Print(printer,variables,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $has_oneof_case_message$;\n}\n"
                      );
    pFVar1 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
    if (*(int *)(*(long *)(pFVar1 + 0x30) + 0x8c) != 3) goto LAB_002b8493;
  }
  WriteFieldDocComment(printer,pFVar1);
  io::Printer::Print(printer,variables,
                     "$deprecation$public int get$capitalized_name$Value() {\n  if ($has_oneof_case_message$) {\n    return (java.lang.Integer) $oneof_name$_;\n  }\n  return $default_number$;\n}\n"
                    );
  pFVar1 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
LAB_002b8493:
  WriteFieldDocComment(printer,pFVar1);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $type$ result = $type$.forNumber((java.lang.Integer) $oneof_name$_);\n    return result == null ? $unknown$ : result;\n  }\n  return $default$;\n}\n"
                    );
  pFVar1 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  if (*(int *)(*(long *)(pFVar1 + 0x30) + 0x8c) == 3) {
    WriteFieldDocComment(printer,pFVar1);
    io::Printer::Print(printer,variables,
                       "private void set$capitalized_name$Value(int value) {\n  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n}\n"
                      );
    pFVar1 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  }
  WriteFieldDocComment(printer,pFVar1);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  $set_oneof_case_message$;\n  $oneof_name$_ = value.getNumber();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n  }\n}\n"
                    );
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $has_oneof_case_message$;\n"
      "}\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public int get$capitalized_name$Value() {\n"
      "  if ($has_oneof_case_message$) {\n"
      "    return (java.lang.Integer) $oneof_name$_;\n"
      "  }\n"
      "  return $default_number$;\n"
      "}\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    $type$ result = $type$.forNumber((java.lang.Integer) $oneof_name$_);\n"
    "    return result == null ? $unknown$ : result;\n"
    "  }\n"
    "  return $default$;\n"
    "}\n");

  // Generate private setters for the builder to proxy into.
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "private void set$capitalized_name$Value(int value) {\n"
      "  $set_oneof_case_message$;\n"
      "  $oneof_name$_ = value;\n"
      "}\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  $set_oneof_case_message$;\n"
    "  $oneof_name$_ = value.getNumber();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    $clear_oneof_case_message$;\n"
    "    $oneof_name$_ = null;\n"
    "  }\n"
    "}\n");
}